

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.cpp
# Opt level: O0

Class * __thiscall
Population::crossover(Class *__return_storage_ptr__,Population *this,Class *class1,Class *class2)

{
  undefined4 uVar1;
  bool bVar2;
  Class *class2_local;
  Class *class1_local;
  Population *this_local;
  Class *res;
  
  Class::Class(__return_storage_ptr__);
  Time::operator=(&__return_storage_ptr__->time,&class1->time);
  Group::operator=(&__return_storage_ptr__->group,&class2->group);
  bVar2 = RandomBool();
  if (bVar2) {
    uVar1 = *(undefined4 *)&(class1->room).field_0x4;
    (__return_storage_ptr__->room).number = (class1->room).number;
    *(undefined4 *)&(__return_storage_ptr__->room).field_0x4 = uVar1;
    (__return_storage_ptr__->room).capacity = (class1->room).capacity;
  }
  else {
    uVar1 = *(undefined4 *)&(class2->room).field_0x4;
    (__return_storage_ptr__->room).number = (class2->room).number;
    *(undefined4 *)&(__return_storage_ptr__->room).field_0x4 = uVar1;
    (__return_storage_ptr__->room).capacity = (class2->room).capacity;
  }
  bVar2 = RandomBool();
  if (bVar2) {
    Teacher::operator=(&__return_storage_ptr__->teacher,&class1->teacher);
  }
  else {
    Teacher::operator=(&__return_storage_ptr__->teacher,&class2->teacher);
  }
  bVar2 = RandomBool();
  if (bVar2) {
    Subject::operator=(&__return_storage_ptr__->subject,&class1->subject);
    Teacher::operator=(&__return_storage_ptr__->teacher,&class1->teacher);
  }
  else {
    Subject::operator=(&__return_storage_ptr__->subject,&class2->subject);
    Teacher::operator=(&__return_storage_ptr__->teacher,&class2->teacher);
  }
  return __return_storage_ptr__;
}

Assistant:

Class Population::crossover(const Class& class1, const Class& class2) const {
    Class res;
    res.time = class1.time;
    res.group = class2.group;
    if (RandomBool()) {
        res.room = class1.room;
    } else {
        res.room = class2.room;
    }

    if (RandomBool()) {
        res.teacher = class1.teacher;
    } else {
        res.teacher = class2.teacher;
    }

    if (RandomBool()) {
        res.subject = class1.subject;
        res.teacher = class1.teacher;
    } else {
        res.subject = class2.subject;
        res.teacher = class2.teacher;
    }

    return res;
}